

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O3

void __thiscall
Formula_Constraint::Formula_Constraint(Formula_Constraint *this,Am_Formula_Data *in_data)

{
  Am_Wrapper *pAVar1;
  
  (this->super_Am_Formula_Advanced).super_Am_Constraint.super_Am_Registered_Type.
  _vptr_Am_Registered_Type = (_func_int **)&PTR_ID_002e2508;
  this->type = in_data->type;
  this->internal_remove = false;
  this->flags = 0;
  (this->context).data = (Am_Slot_Data *)0x0;
  this->formula = in_data->form_data;
  this->depends_on = (Dependency *)0x0;
  pAVar1 = in_data->stored_data;
  this->data = pAVar1;
  this->prototype = (Formula_Constraint *)0x0;
  this->first_instance = (Formula_Constraint *)0x0;
  this->next_instance = (Formula_Constraint *)0x0;
  if (pAVar1 != (Am_Wrapper *)0x0) {
    pAVar1->refs = pAVar1->refs + 1;
  }
  return;
}

Assistant:

Formula_Constraint::Formula_Constraint(Am_Formula_Data *in_data)
    : context(nullptr), formula(in_data->form_data), type(in_data->type),
#ifdef DEBUG
      formula_name(in_data->name),
#endif
      flags(0), data(in_data->stored_data), depends_on(nullptr), prototype(nullptr),
      first_instance(nullptr), next_instance(nullptr), internal_remove(false)
{
  if (in_data->stored_data)
    in_data->stored_data->Note_Reference();
}